

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void QApplicationPrivate::translateTouchCancel(QPointingDevice *device,ulong timestamp)

{
  Span *pSVar1;
  KeyboardModifiers modifiers;
  QObject *pQVar2;
  ulong uVar3;
  long lVar4;
  EventPointData *epd;
  QEventPoint *p;
  long in_FS_OFFSET;
  QMutableTouchEvent touchEvent;
  QHash<QWidget_*,_QHashDummyValue> local_b0;
  QArrayDataPointer<QEventPoint> local_a8;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QObject *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)QGuiApplication::keyboardModifiers();
  local_a8._0_16_ = ZEXT816(0);
  local_a8.size = 0;
  QMutableTouchEvent::QMutableTouchEvent
            ((QMutableTouchEvent *)&local_88,TouchCancel,device,modifiers,
             (QList<QEventPoint> *)&local_a8);
  QArrayDataPointer<QEventPoint>::~QArrayDataPointer(&local_a8);
  QPointerEvent::setTimestamp((ulonglong)&local_88);
  local_b0.d = (Data *)0x0;
  p = *(QEventPoint **)(*(long *)(device + 8) + 0x168);
  for (lVar4 = *(long *)(*(long *)(device + 8) + 0x160) * 0x58; lVar4 != 0; lVar4 = lVar4 + -0x58) {
    pQVar2 = QMutableEventPoint::target(p);
    if ((pQVar2 != (QObject *)0x0) && ((*(byte *)(*(long *)(pQVar2 + 8) + 0x30) & 1) != 0)) {
      QSet<QWidget_*>::insert((QSet<QWidget_*> *)&local_a8,(QWidget **)&local_b0);
    }
    p = p + 0xb;
  }
  local_a8._0_16_ = QHash<QWidget_*,_QHashDummyValue>::constBegin(&local_b0);
  while( true ) {
    if (local_a8.d == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0 &&
        local_a8.ptr == 0) break;
    pSVar1 = (local_a8.d)->spans;
    uVar3 = local_a8.ptr >> 7;
    local_48 = *(QObject **)
                pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)local_a8.ptr & 0x7f]].storage.data
    ;
    QCoreApplication::sendSpontaneousEvent(local_48,(QEvent *)&local_88);
    QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::operator++
              ((iterator<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)&local_a8);
  }
  QHash<QWidget_*,_QHashDummyValue>::~QHash(&local_b0);
  QMutableTouchEvent::~QMutableTouchEvent((QMutableTouchEvent *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::translateTouchCancel(const QPointingDevice *device, ulong timestamp)
{
    QMutableTouchEvent touchEvent(QEvent::TouchCancel, device, QGuiApplication::keyboardModifiers());
    touchEvent.setTimestamp(timestamp);

    QSet<QWidget *> widgetsNeedingCancel;
    const QPointingDevicePrivate *devPriv = QPointingDevicePrivate::get(device);
    for (auto &epd : devPriv->activePoints.values()) {
        const auto &pt = epd.eventPoint;
        QObject *target = QMutableEventPoint::target(pt);
        if (target && target->isWidgetType())
            widgetsNeedingCancel.insert(static_cast<QWidget *>(target));
    }
    for (QSet<QWidget *>::const_iterator widIt = widgetsNeedingCancel.constBegin(),
         widItEnd = widgetsNeedingCancel.constEnd(); widIt != widItEnd; ++widIt) {
        QWidget *widget = *widIt;
        touchEvent.setTarget(widget);
        QApplication::sendSpontaneousEvent(widget, &touchEvent);
    }
}